

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void btreeEndTransaction(Btree *p)

{
  int *piVar1;
  sqlite3 *psVar2;
  BtShared *pBVar3;
  MemPage *pPage;
  ushort uVar4;
  BtLock *pBVar5;
  BtLock **ppBVar6;
  
  psVar2 = p->db;
  pBVar3 = p->pBt;
  pBVar3->bDoTruncate = '\0';
  if (p->inTrans == '\0') goto LAB_0014002d;
  if (1 < psVar2->nVdbeRead) {
    if (pBVar3->pWriter == p) {
      pBVar3->pWriter = (Btree *)0x0;
      *(byte *)&pBVar3->btsFlags = (byte)pBVar3->btsFlags & 0x3f;
      for (pBVar5 = pBVar3->pLock; pBVar5 != (BtLock *)0x0; pBVar5 = pBVar5->pNext) {
        pBVar5->eLock = '\x01';
      }
    }
    p->inTrans = '\x01';
    return;
  }
  if (p->inTrans == '\0') goto LAB_0014002d;
  pBVar5 = pBVar3->pLock;
  if (pBVar5 != (BtLock *)0x0) {
    ppBVar6 = &pBVar3->pLock;
    do {
      if (pBVar5->pBtree == p) {
        *ppBVar6 = pBVar5->pNext;
        if (pBVar5->iTable != 1) {
          sqlite3_free(pBVar5);
        }
      }
      else {
        ppBVar6 = &pBVar5->pNext;
      }
      pBVar5 = *ppBVar6;
    } while (pBVar5 != (BtLock *)0x0);
  }
  if (pBVar3->pWriter == p) {
    pBVar3->pWriter = (Btree *)0x0;
    uVar4 = 0xff3f;
LAB_0014001d:
    pBVar3->btsFlags = pBVar3->btsFlags & uVar4;
  }
  else {
    uVar4 = 0xff7f;
    if (pBVar3->nTransaction == 2) goto LAB_0014001d;
  }
  piVar1 = &pBVar3->nTransaction;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 == 0) {
    pBVar3->inTransaction = '\0';
  }
LAB_0014002d:
  p->inTrans = '\0';
  if ((pBVar3->inTransaction == '\0') && (pPage = pBVar3->pPage1, pPage != (MemPage *)0x0)) {
    pBVar3->pPage1 = (MemPage *)0x0;
    releasePageOne(pPage);
    return;
  }
  return;
}

Assistant:

static void btreeEndTransaction(Btree *p){
  BtShared *pBt = p->pBt;
  sqlite3 *db = p->db;
  assert( sqlite3BtreeHoldsMutex(p) );

#ifndef SQLITE_OMIT_AUTOVACUUM
  pBt->bDoTruncate = 0;
#endif
  if( p->inTrans>TRANS_NONE && db->nVdbeRead>1 ){
    /* If there are other active statements that belong to this database
    ** handle, downgrade to a read-only transaction. The other statements
    ** may still be reading from the database.  */
    downgradeAllSharedCacheTableLocks(p);
    p->inTrans = TRANS_READ;
  }else{
    /* If the handle had any kind of transaction open, decrement the
    ** transaction count of the shared btree. If the transaction count
    ** reaches 0, set the shared state to TRANS_NONE. The unlockBtreeIfUnused()
    ** call below will unlock the pager.  */
    if( p->inTrans!=TRANS_NONE ){
      clearAllSharedCacheTableLocks(p);
      pBt->nTransaction--;
      if( 0==pBt->nTransaction ){
        pBt->inTransaction = TRANS_NONE;
      }
    }

    /* Set the current transaction state to TRANS_NONE and unlock the
    ** pager if this call closed the only read or write transaction.  */
    p->inTrans = TRANS_NONE;
    unlockBtreeIfUnused(pBt);
  }

  btreeIntegrity(p);
}